

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iris_dataset.cpp
# Opt level: O3

void __thiscall Data::iris_dataset::print_data(iris_dataset *this)

{
  iris_data *__x;
  pointer pcVar1;
  pointer pdVar2;
  ostream *poVar3;
  pointer *ppdVar4;
  vector<double,_std::allocator<double>_> local_60;
  pointer local_40;
  pointer local_38;
  
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Classname\tValues\tTarget",0x17);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
  std::ostream::put('p');
  std::ostream::flush();
  local_38 = (this->dataset_rows).
             super__Vector_base<Data::iris_data_*,_std::allocator<Data::iris_data_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  local_40 = (this->dataset_rows).
             super__Vector_base<Data::iris_data_*,_std::allocator<Data::iris_data_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (local_38 != local_40) {
    do {
      ppdVar4 = &local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      __x = *local_38;
      pcVar1 = (__x->class_name)._M_dataplus._M_p;
      local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)ppdVar4;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_60,pcVar1,pcVar1 + (__x->class_name)._M_string_length);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cout,
                          (char *)local_60.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                          (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl
                                .super__Vector_impl_data._M_finish);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"\t",1);
      if ((pointer *)
          local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != ppdVar4) {
        operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage + 1);
      }
      std::vector<double,_std::allocator<double>_>::vector(&local_60,&__x->values);
      pdVar2 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (ppdVar4 = (pointer *)
                     local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start; ppdVar4 != (pointer *)pdVar2;
          ppdVar4 = ppdVar4 + 1) {
        printf("%.2f,",*ppdVar4);
      }
      if ((pointer *)
          local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer *)0x0) {
        operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\t",1);
      std::vector<double,_std::allocator<double>_>::vector(&local_60,&__x->target);
      pdVar2 = local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (ppdVar4 = (pointer *)
                     local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start; ppdVar4 != (pointer *)pdVar2;
          ppdVar4 = ppdVar4 + 1) {
        poVar3 = std::ostream::_M_insert<double>((double)*ppdVar4);
        std::__ostream_insert<char,std::char_traits<char>>(poVar3,", ",2);
      }
      if ((pointer *)
          local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer *)0x0) {
        operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'p');
      std::ostream::put('p');
      std::ostream::flush();
      local_38 = local_38 + 1;
    } while (local_38 != local_40);
  }
  return;
}

Assistant:

void Data::iris_dataset::print_data() {
    std::cout << "Classname\tValues\tTarget" << std::endl;
    for (iris_data *iris : this->dataset_rows) {
        std::cout << iris->get_class_name() << "\t";

        for (double value : iris->get_values())
            printf("%.2f,", value);

        std::cout << "\t";

        for (double target : iris->get_target())
            std::cout << target << ", ";

        std::cout << std::endl;
    }
}